

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_restr_free(ly_ctx *ctx,lys_restr *restr,
                   _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x661,
                  "void lys_restr_free(struct ly_ctx *, struct lys_restr *, void (*)(const struct lys_node *, void *))"
                 );
  }
  if (restr != (lys_restr *)0x0) {
    lys_extension_instances_free(ctx,restr->ext,(uint)restr->ext_size,private_destructor);
    lydict_remove(ctx,restr->expr);
    lydict_remove(ctx,restr->dsc);
    lydict_remove(ctx,restr->ref);
    lydict_remove(ctx,restr->eapptag);
    lydict_remove(ctx,restr->emsg);
    return;
  }
  return;
}

Assistant:

void
lys_restr_free(struct ly_ctx *ctx, struct lys_restr *restr,
               void (*private_destructor)(const struct lys_node *node, void *priv))
{
    assert(ctx);
    if (!restr) {
        return;
    }

    lys_extension_instances_free(ctx, restr->ext, restr->ext_size, private_destructor);
    lydict_remove(ctx, restr->expr);
    lydict_remove(ctx, restr->dsc);
    lydict_remove(ctx, restr->ref);
    lydict_remove(ctx, restr->eapptag);
    lydict_remove(ctx, restr->emsg);
}